

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall
glslang::HlslGrammar::acceptMemberFunctionDefinition
          (HlslGrammar *this,TIntermNode **nodeList,TType *type,TString *memberName,
          TFunctionDeclarator *declarator)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  TFunction *this_00;
  long lVar4;
  undefined4 extraout_var;
  TQualifier *qualifier;
  TVector<glslang::HlslToken> *this_01;
  TString **name;
  size_t s;
  TString *local_40;
  TString *functionName;
  TFunctionDeclarator *pTStack_30;
  bool accepted;
  TFunctionDeclarator *declarator_local;
  TString *memberName_local;
  TType *type_local;
  TIntermNode **nodeList_local;
  HlslGrammar *this_local;
  
  functionName._7_1_ = 0;
  name = &local_40;
  local_40 = memberName;
  pTStack_30 = declarator;
  declarator_local = (TFunctionDeclarator *)memberName;
  memberName_local = (TString *)type;
  type_local = (TType *)nodeList;
  nodeList_local = (TIntermNode **)this;
  HlslParseContext::getFullNamespaceName(this->parseContext,name);
  this_00 = (TFunction *)TSymbol::operator_new((TSymbol *)0x160,(size_t)name);
  TFunction::TFunction(this_00,local_40,(TType *)memberName_local,EOpNull);
  pTStack_30->function = this_00;
  lVar4 = (*(code *)((memberName_local->_M_dataplus).super_allocator_type.allocator)->totalBytes)();
  if ((*(ulong *)(lVar4 + 8) & 0x7f) == 0) {
    (*(pTStack_30->function->super_TSymbol)._vptr_TSymbol[0x20])();
  }
  else {
    (*(pTStack_30->function->super_TSymbol)._vptr_TSymbol[0x22])();
  }
  bVar2 = acceptFunctionParameters(this,pTStack_30->function);
  if (bVar2) {
    iVar3 = (*(pTStack_30->function->super_TSymbol)._vptr_TSymbol[0xd])();
    qualifier = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x50))();
    acceptPostDecls(this,qualifier);
    s = 0x167;
    bVar2 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftBrace);
    if (bVar2) {
      (pTStack_30->loc).name = (this->super_HlslTokenStream).token.loc.name;
      iVar3 = (this->super_HlslTokenStream).token.loc.line;
      (pTStack_30->loc).string = (this->super_HlslTokenStream).token.loc.string;
      (pTStack_30->loc).line = iVar3;
      uVar1 = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
      (pTStack_30->loc).column = (this->super_HlslTokenStream).token.loc.column;
      *(undefined4 *)&(pTStack_30->loc).field_0x14 = uVar1;
      this_01 = (TVector<glslang::HlslToken> *)
                TVector<glslang::HlslToken>::operator_new((TVector<glslang::HlslToken> *)0x20,s);
      TVector<glslang::HlslToken>::TVector(this_01);
      pTStack_30->body = this_01;
      functionName._7_1_ =
           acceptFunctionDefinition(this,pTStack_30,(TIntermNode **)type_local,pTStack_30->body);
    }
  }
  else {
    expected(this,"function parameter list");
  }
  return (bool)(functionName._7_1_ & 1);
}

Assistant:

bool HlslGrammar::acceptMemberFunctionDefinition(TIntermNode*& nodeList, const TType& type, TString& memberName,
                                                 TFunctionDeclarator& declarator)
{
    bool accepted = false;

    TString* functionName = &memberName;
    parseContext.getFullNamespaceName(functionName);
    declarator.function = new TFunction(functionName, type);
    if (type.getQualifier().storage == EvqTemporary)
        declarator.function->setImplicitThis();
    else
        declarator.function->setIllegalImplicitThis();

    // function_parameters
    if (acceptFunctionParameters(*declarator.function)) {
        // post_decls
        acceptPostDecls(declarator.function->getWritableType().getQualifier());

        // compound_statement (function body definition)
        if (peekTokenClass(EHTokLeftBrace)) {
            declarator.loc = token.loc;
            declarator.body = new TVector<HlslToken>;
            accepted = acceptFunctionDefinition(declarator, nodeList, declarator.body);
        }
    } else
        expected("function parameter list");

    return accepted;
}